

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionDAGChecker.cxx
# Opt level: O0

bool __thiscall
cmGeneratorExpressionDAGChecker::EvaluatingPICExpression(cmGeneratorExpressionDAGChecker *this)

{
  bool bVar1;
  cmGeneratorExpressionDAGChecker *local_20;
  cmGeneratorExpressionDAGChecker *parent;
  cmGeneratorExpressionDAGChecker *top;
  cmGeneratorExpressionDAGChecker *this_local;
  
  parent = this;
  for (local_20 = this->Parent; local_20 != (cmGeneratorExpressionDAGChecker *)0x0;
      local_20 = local_20->Parent) {
    parent = local_20;
  }
  bVar1 = std::operator==(&parent->Property,"INTERFACE_POSITION_INDEPENDENT_CODE");
  return bVar1;
}

Assistant:

bool cmGeneratorExpressionDAGChecker::EvaluatingPICExpression()
{
  const cmGeneratorExpressionDAGChecker* top = this;
  const cmGeneratorExpressionDAGChecker* parent = this->Parent;
  while (parent) {
    top = parent;
    parent = parent->Parent;
  }

  return top->Property == "INTERFACE_POSITION_INDEPENDENT_CODE";
}